

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void __thiscall
duckdb::BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t>::LoadNextGroup
          (BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this)

{
  uhugeint_t *this_00;
  undefined4 *puVar1;
  BitpackingMode BVar2;
  uint uVar3;
  uint *puVar4;
  uint64_t *puVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint64_t uVar9;
  uint8_t uVar10;
  data_ptr_t pdVar11;
  InternalException *pIVar12;
  string local_40;
  
  this->current_group_offset = 0;
  puVar4 = (uint *)this->bitpacking_metadata_ptr;
  uVar3 = *puVar4;
  this->current_group =
       (bitpacking_metadata_t)
       ((ulong)(uVar3 & 0xffffff) << 0x20 | (ulong)*(byte *)((long)puVar4 + 3));
  this->bitpacking_metadata_ptr = (data_ptr_t)(puVar4 + -1);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  pdVar11 = ((this->handle).node.ptr)->buffer +
            (ulong)(uVar3 & 0xffffff) + this->current_segment->offset;
  this->current_group_ptr = pdVar11;
  BVar2 = (this->current_group).mode;
  if (3 < (byte)(BVar2 - CONSTANT)) {
    pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Invalid bitpacking mode","");
    InternalException::InternalException(pIVar12,&local_40);
    __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar6 = *(undefined4 *)(pdVar11 + 4);
  uVar7 = *(undefined4 *)(pdVar11 + 8);
  uVar8 = *(undefined4 *)(pdVar11 + 0xc);
  puVar1 = (undefined4 *)
           ((long)this->decompression_buffer +
           *(long *)(&DAT_01e1c1b0 + (ulong)(byte)(BVar2 - CONSTANT) * 8) + -0x28);
  *puVar1 = *(undefined4 *)pdVar11;
  puVar1[1] = uVar6;
  puVar1[2] = uVar7;
  puVar1[3] = uVar8;
  this_00 = (uhugeint_t *)(pdVar11 + 0x10);
  this->current_group_ptr = (data_ptr_t)this_00;
  if (BVar2 - 4 < 2) {
    uVar10 = uhugeint_t::operator_cast_to_unsigned_char(this_00);
    this->current_width = uVar10;
    pdVar11 = this->current_group_ptr + 0x10;
  }
  else {
    if (BVar2 == CONSTANT) goto LAB_0109c297;
    if (BVar2 != CONSTANT_DELTA) {
      pIVar12 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Invalid bitpacking mode","");
      InternalException::InternalException(pIVar12,&local_40);
      __cxa_throw(pIVar12,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar9 = *(uint64_t *)(pdVar11 + 0x18);
    (this->current_constant).lower = this_00->lower;
    (this->current_constant).upper = uVar9;
    pdVar11 = pdVar11 + 0x20;
  }
  this->current_group_ptr = pdVar11;
LAB_0109c297:
  if ((this->current_group).mode == DELTA_FOR) {
    puVar5 = (uint64_t *)this->current_group_ptr;
    uVar9 = puVar5[1];
    (this->current_delta_offset).lower = *puVar5;
    (this->current_delta_offset).upper = uVar9;
    this->current_group_ptr = (data_ptr_t)(puVar5 + 2);
  }
  return;
}

Assistant:

void LoadNextGroup() {
		D_ASSERT(bitpacking_metadata_ptr > handle.Ptr() &&
		         (bitpacking_metadata_ptr < handle.Ptr() + current_segment.GetBlockManager().GetBlockSize()));
		current_group_offset = 0;
		current_group = DecodeMeta(reinterpret_cast<bitpacking_metadata_encoded_t *>(bitpacking_metadata_ptr));

		bitpacking_metadata_ptr -= sizeof(bitpacking_metadata_encoded_t);
		current_group_ptr = GetPtr(current_group);

		// Read first value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::CONSTANT_DELTA:
		case BitpackingMode::DELTA_FOR:
			current_frame_of_reference = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read second value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT_DELTA:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::DELTA_FOR:
			current_width = (bitpacking_width_t)(*reinterpret_cast<T *>(current_group_ptr));
			current_group_ptr += MaxValue(sizeof(T), sizeof(bitpacking_width_t));
			break;
		case BitpackingMode::CONSTANT:
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read third value
		if (current_group.mode == BitpackingMode::DELTA_FOR) {
			current_delta_offset = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
		}
	}